

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_signparameter.cpp
# Opt level: O0

void __thiscall
SignParameter_StringConstructorTest_Test::~SignParameter_StringConstructorTest_Test
          (SignParameter_StringConstructorTest_Test *this)

{
  void *in_RDI;
  
  ~SignParameter_StringConstructorTest_Test((SignParameter_StringConstructorTest_Test *)0x20fb68);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SignParameter, StringConstructorTest)
{
  const ByteData expect_bytedata_00("00");
  // constructor
  SignParameter sign_parameter = SignParameter("OP_0");
  CompareSignparameter(sign_parameter, expect_bytedata_00,
      SignDataType::kOpCode, Pubkey(), false, SigHashType(), expect_bytedata_00);

  const ByteData expect_bytedata_true("51");
  // constructor
  sign_parameter = SignParameter("OP_TRUE");
  CompareSignparameter(sign_parameter, expect_bytedata_true,
      SignDataType::kOpCode, Pubkey(), false, SigHashType(), expect_bytedata_true);

  const ByteData expect_bytedata_msig("ae");
  // constructor
  sign_parameter = SignParameter("OP_CHECKMULTISIG");
  CompareSignparameter(sign_parameter, expect_bytedata_msig,
      SignDataType::kOpCode, Pubkey(), false, SigHashType(), expect_bytedata_msig);

  const Script expect_script("2102ddeda4a5b67955c32247c28379cf3461c872e34f96ec94ddd61c66bbcfda1906ac");
  // constructor
  sign_parameter = SignParameter(expect_script.GetHex());
  CompareSignparameter(sign_parameter, expect_script.GetData(),
      SignDataType::kBinary, Pubkey(), false, SigHashType(), expect_script.GetData());

  const Pubkey expect_pubkey("0369809d2cfc44f823249169f44bf9de20fc6ed1d88482540831289947f7e82af5");
  // constructor
  sign_parameter = SignParameter(expect_pubkey.GetHex());
  CompareSignparameter(sign_parameter, expect_pubkey.GetData(),
      SignDataType::kBinary, Pubkey(), false, SigHashType(), expect_pubkey.GetData());

  const ByteData expect_message("773420c0ded41a55b1f1205cfb632f08f3f911a53e7338a0dac73ec6cbe3ca471907434d046185abedc5afddc2761a642bccc70af6d22b46394f1d04a8b24226");
  const SigHashType expect_sighashtype(SigHashAlgorithm::kSigHashAll);
  const ByteData expect_signature("30440220773420c0ded41a55b1f1205cfb632f08f3f911a53e7338a0dac73ec6cbe3ca4702201907434d046185abedc5afddc2761a642bccc70af6d22b46394f1d04a8b2422601");
  // constructor
  sign_parameter = SignParameter(expect_message.GetHex(), true);
  CompareSignparameter(sign_parameter, expect_message,
      SignDataType::kSign, Pubkey(), true, expect_sighashtype,
      expect_signature);
}